

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

void addinfo(lua_State *L,char *msg)

{
  CallInfo *ci;
  long lVar1;
  uint uVar2;
  char buff [60];
  
  ci = L->ci;
  if ((ci->callstatus & 1) != 0) {
    uVar2 = currentline(ci);
    lVar1 = *(long *)(*(long *)((ci->func->value_).f + 0x18) + 0x48);
    if (lVar1 == 0) {
      buff[0] = '?';
      buff[1] = '\0';
    }
    else {
      luaO_chunkid(buff,(char *)(lVar1 + 0x18),0x3c);
    }
    luaO_pushfstring(L,"%s:%d: %s",buff,(ulong)uVar2,msg);
  }
  return;
}

Assistant:

static void addinfo (lua_State *L, const char *msg) {
  CallInfo *ci = L->ci;
  if (isLua(ci)) {  /* is Lua code? */
    char buff[LUA_IDSIZE];  /* add file:line information */
    int line = currentline(ci);
    TString *src = ci_func(ci)->p->source;
    if (src)
      luaO_chunkid(buff, getstr(src), LUA_IDSIZE);
    else {  /* no source available; use "?" instead */
      buff[0] = '?'; buff[1] = '\0';
    }
    luaO_pushfstring(L, "%s:%d: %s", buff, line, msg);
  }
}